

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshrec.c
# Opt level: O2

FT_Error ps_mask_set_bit(PS_Mask mask,FT_UInt idx,FT_Memory memory)

{
  FT_Error FVar1;
  
  if (mask->num_bits <= idx) {
    FVar1 = ps_mask_ensure(mask,idx + 1,memory);
    if (FVar1 != 0) {
      return FVar1;
    }
    mask->num_bits = idx + 1;
  }
  mask->bytes[idx >> 3] = mask->bytes[idx >> 3] | (byte)(0x80 >> ((byte)idx & 7));
  return 0;
}

Assistant:

static FT_Error
  ps_mask_set_bit( PS_Mask    mask,
                   FT_UInt    idx,
                   FT_Memory  memory )
  {
    FT_Error  error = FT_Err_Ok;
    FT_Byte*  p;


    if ( idx >= mask->num_bits )
    {
      error = ps_mask_ensure( mask, idx + 1, memory );
      if ( error )
        goto Exit;

      mask->num_bits = idx + 1;
    }

    p    = mask->bytes + ( idx >> 3 );
    p[0] = (FT_Byte)( p[0] | ( 0x80 >> ( idx & 7 ) ) );

  Exit:
    return error;
  }